

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

bool __thiscall
FuncCallSpecs::lateRestriction
          (FuncCallSpecs *this,FuncProto *restrictedProto,
          vector<Varnode_*,_std::allocator<Varnode_*>_> *newinput,Varnode **newoutput)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  
  if ((this->super_FuncProto).model == (ProtoModel *)0x0) {
    FuncProto::copy(&this->super_FuncProto,(EVP_PKEY_CTX *)restrictedProto,(EVP_PKEY_CTX *)newinput)
    ;
    return true;
  }
  bVar1 = FuncProto::isCompatible(&this->super_FuncProto,restrictedProto);
  if (((bVar1) &&
      ((FuncProto::copy(&this->super_FuncProto,(EVP_PKEY_CTX *)restrictedProto,src),
       ((this->super_FuncProto).flags & 1) == 0 || (this->isinputactive == true)))) &&
     ((bVar1 = FuncProto::isInputLocked(&this->super_FuncProto), !bVar1 ||
      (bVar1 = transferLockedInput(this,newinput), bVar1)))) {
    bVar1 = FuncProto::isOutputLocked(&this->super_FuncProto);
    if (!bVar1) {
      return true;
    }
    transferLockedOutput(this,newoutput);
    return true;
  }
  return false;
}

Assistant:

bool FuncCallSpecs::lateRestriction(const FuncProto &restrictedProto,vector<Varnode *> &newinput,Varnode *&newoutput)

{
  if (!hasModel()) {
    copy(restrictedProto);
    return true;
  }

  if (!isCompatible(restrictedProto)) return false;
  copy(restrictedProto);		// Convert ourselves to restrictedProto
  //  if (!isInputLocked()) return false;
  if (isDotdotdot() && (!isinputactive)) return false;

  // Redo all the varnode inputs (if possible)
  if (isInputLocked())
    if (!transferLockedInput(newinput)) return false;
  // Redo all the varnode outputs (if possible)
  if (isOutputLocked())
    if (!transferLockedOutput(newoutput)) return false;

  return true;
}